

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

int set_corn(level *lev,int x1,int y1,int x2,int y2,int x3,int y3,int x4,int y4)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = check_pos(lev,x4,y4,1);
  if (iVar1 == 0) {
    iVar1 = check_pos(lev,x3,y3,1);
    iVar2 = check_pos(lev,x2,y2,1);
    iVar3 = check_pos(lev,x1,y1,1);
    uVar4 = (uint)(iVar1 != 0 && (iVar2 != 0 && iVar3 != 0));
  }
  else {
    uVar4 = 2;
  }
  return uVar4;
}

Assistant:

static int set_corn(struct level *lev, int x1, int y1, int x2, int y2,
		    int x3, int y3, int x4, int y4)
{
    int wmode, is_1, is_2, is_3, is_4;

    is_1 = check_pos(lev, x1, y1, 1);
    is_2 = check_pos(lev, x2, y2, 1);
    is_3 = check_pos(lev, x3, y3, 1);
    is_4 = check_pos(lev, x4, y4, 1);	/* inner location */

    /*
     * All 4 should not be true.  So if the inner location is rock,
     * use it.  If all of the outer 3 are true, use outer.  We currently
     * can't cover the case where only part of the outer is rock, so
     * we just say that all the walls are finished (if not overridden
     * by the inner section).
     */
    if (is_4) {
	wmode = WM_C_INNER;
    } else if (is_1 && is_2 && is_3)
	wmode = WM_C_OUTER;
     else
	wmode = 0;	/* finished walls on all sides */

    return wmode;
}